

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  ulong uVar1;
  pointer p;
  size_type sVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->len == 0x1fffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar1 = this->cap;
  if (uVar7 < uVar1 * 2) {
    uVar7 = uVar1 * 2;
  }
  if (0x1fffffffffffffff - uVar1 < uVar1) {
    uVar7 = 0x1fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pBVar5 = (pointer)operator_new(uVar7 * 4);
  *(uint32_t *)((long)pBVar5 + lVar8) = args->id;
  p = this->data_;
  sVar2 = this->len;
  lVar6 = (long)p + (sVar2 * 4 - (long)pos);
  pBVar3 = p;
  pBVar4 = pBVar5;
  if (lVar6 == 0) {
    if (sVar2 != 0) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&pBVar5->id + lVar6) = *(undefined4 *)((long)&p->id + lVar6);
        lVar6 = lVar6 + 4;
      } while (sVar2 << 2 != lVar6);
    }
  }
  else {
    for (; pBVar3 != pos; pBVar3 = pBVar3 + 1) {
      pBVar4->id = pBVar3->id;
      pBVar4 = pBVar4 + 1;
    }
    memcpy((void *)((long)pBVar5 + lVar8 + 4),pos,(lVar6 - 4U & 0xfffffffffffffffc) + 4);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = pBVar5;
  return (pointer)((long)pBVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}